

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printCompression(Compression c)

{
  int in_EDI;
  
  switch(in_EDI) {
  case 0:
    std::operator<<((ostream *)&std::cout,"none");
    break;
  case 1:
    std::operator<<((ostream *)&std::cout,"run-length encoding");
    break;
  case 2:
    std::operator<<((ostream *)&std::cout,"zip, individual scanlines");
    break;
  case 3:
    std::operator<<((ostream *)&std::cout,"zip, multi-scanline blocks");
    break;
  case 4:
    std::operator<<((ostream *)&std::cout,"piz");
    break;
  case 5:
    std::operator<<((ostream *)&std::cout,"pxr24");
    break;
  case 6:
    std::operator<<((ostream *)&std::cout,"b44");
    break;
  case 7:
    std::operator<<((ostream *)&std::cout,"b44a");
    break;
  case 8:
    std::operator<<((ostream *)&std::cout,"dwa, small scanline blocks");
    break;
  case 9:
    std::operator<<((ostream *)&std::cout,"dwa, medium scanline blocks");
    break;
  default:
    std::ostream::operator<<(&std::cout,in_EDI);
  }
  return;
}

Assistant:

void
printCompression (Compression c)
{
    switch (c)
    {
        case NO_COMPRESSION: cout << "none"; break;

        case RLE_COMPRESSION: cout << "run-length encoding"; break;

        case ZIPS_COMPRESSION: cout << "zip, individual scanlines"; break;

        case ZIP_COMPRESSION: cout << "zip, multi-scanline blocks"; break;

        case PIZ_COMPRESSION: cout << "piz"; break;

        case PXR24_COMPRESSION: cout << "pxr24"; break;

        case B44_COMPRESSION: cout << "b44"; break;

        case B44A_COMPRESSION: cout << "b44a"; break;

        case DWAA_COMPRESSION: cout << "dwa, small scanline blocks"; break;

        case DWAB_COMPRESSION: cout << "dwa, medium scanline blocks"; break;

        default: cout << int (c); break;
    }
}